

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddUtil.c
# Opt level: O1

DdNode ** Cudd_bddPickArbitraryMinterms(DdManager *dd,DdNode *f,DdNode **vars,int n,int k)

{
  int *piVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  DdNode **string;
  DdNode *pDVar5;
  ulong uVar6;
  DdNode **__ptr;
  DdNode **__ptr_00;
  char *__s2;
  ulong uVar7;
  ulong uVar8;
  DdNode *pDVar9;
  uint uVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  bool bVar15;
  double dVar16;
  int local_7c;
  ulong local_70;
  DdNode **local_60;
  
  uVar14 = (ulong)(uint)k;
  dVar16 = Cudd_CountMinterm(dd,f,n);
  if (dVar16 < (double)k) {
    return (DdNode **)0x0;
  }
  uVar10 = dd->size;
  lVar11 = (long)(int)uVar10;
  string = (DdNode **)malloc((long)k << 3);
  if (string == (DdNode **)0x0) {
    dd->errorCode = CUDD_MEMORY_OUT;
    return (DdNode **)0x0;
  }
  if (0 < k) {
    uVar12 = 0;
    do {
      pDVar5 = (DdNode *)malloc(lVar11 + 1);
      string[uVar12] = pDVar5;
      if (pDVar5 == (DdNode *)0x0) {
        if (uVar12 != 0) {
          uVar14 = uVar12 & 0xffffffff;
          do {
            if (string[uVar12] != (DdNode *)0x0) {
              free(string[uVar12]);
              string[uVar12] = (DdNode *)0x0;
            }
            uVar10 = (int)uVar14 - 1;
            uVar14 = (ulong)uVar10;
          } while (uVar10 != 0);
        }
        free(string);
        dd->errorCode = CUDD_MEMORY_OUT;
        return (DdNode **)0x0;
      }
      if (0 < (int)uVar10) {
        uVar6 = 0;
        do {
          *(char *)((long)&string[uVar12]->index + uVar6) = '2';
          uVar6 = uVar6 + 1;
        } while (uVar10 != uVar6);
      }
      *(char *)((long)&string[uVar12]->index + lVar11) = '\0';
      uVar12 = uVar12 + 1;
    } while (uVar12 != uVar14);
  }
  __ptr = (DdNode **)malloc((long)n << 2);
  if (__ptr == (DdNode **)0x0) {
    dd->errorCode = CUDD_MEMORY_OUT;
    __ptr_00 = string;
    if (0 < k) {
      uVar12 = 0;
      do {
        if (string[uVar12] != (DdNode *)0x0) {
          free(string[uVar12]);
          string[uVar12] = (DdNode *)0x0;
        }
        uVar12 = uVar12 + 1;
      } while (uVar14 != uVar12);
    }
  }
  else {
    if (0 < n) {
      uVar12 = 0;
      do {
        *(DdHalfWord *)((long)__ptr + uVar12 * 4) = vars[uVar12]->index;
        uVar12 = uVar12 + 1;
      } while ((uint)n != uVar12);
    }
    iVar4 = ddPickArbitraryMinterms(dd,f,n,k,(char **)string);
    if (iVar4 == 0) {
      if (0 < k) {
        uVar12 = 0;
        do {
          if (string[uVar12] != (DdNode *)0x0) {
            free(string[uVar12]);
            string[uVar12] = (DdNode *)0x0;
          }
          uVar12 = uVar12 + 1;
        } while (uVar14 != uVar12);
      }
    }
    else {
      __ptr_00 = (DdNode **)malloc((long)k << 3);
      if (__ptr_00 != (DdNode **)0x0) {
        __s2 = (char *)malloc(lVar11 + 1);
        if (__s2 != (char *)0x0) {
          if (k < 1) {
LAB_0080a64e:
            free(__s2);
            if (0 < k) {
              uVar14 = 0;
              do {
                piVar1 = (int *)(((ulong)__ptr_00[uVar14] & 0xfffffffffffffffe) + 4);
                *piVar1 = *piVar1 + -1;
                if (string[uVar14] != (DdNode *)0x0) {
                  free(string[uVar14]);
                  string[uVar14] = (DdNode *)0x0;
                }
                uVar14 = uVar14 + 1;
              } while ((uint)k != uVar14);
            }
            free(string);
            free(__ptr);
            return __ptr_00;
          }
          local_70 = (ulong)(k - 1);
          uVar12 = (ulong)(uint)n;
          uVar6 = 0;
          local_7c = -1;
          bVar2 = false;
          local_60 = string;
LAB_0080a3c7:
          local_60 = local_60 + 1;
          if (bVar2) {
            pDVar5 = string[uVar6];
            iVar4 = strcmp((char *)pDVar5,__s2);
            if (iVar4 != 0) {
              uVar13 = 0;
              do {
                if (local_70 == uVar13) goto LAB_0080a44f;
                iVar4 = strcmp((char *)pDVar5,(char *)local_60[uVar13]);
                uVar13 = uVar13 + 1;
              } while (iVar4 != 0);
              goto LAB_0080a430;
            }
            bVar2 = true;
            bVar15 = false;
          }
          else {
            uVar13 = 0;
            do {
              if (local_70 == uVar13) goto LAB_0080a44f;
              pDVar5 = string[uVar6];
              iVar4 = strcmp((char *)pDVar5,(char *)local_60[uVar13]);
              uVar13 = uVar13 + 1;
            } while (iVar4 != 0);
LAB_0080a430:
            strcpy(__s2,(char *)pDVar5);
            bVar15 = true;
            bVar2 = true;
            local_7c = (int)uVar6;
          }
          goto LAB_0080a466;
        }
        dd->errorCode = CUDD_MEMORY_OUT;
        if (0 < k) {
          uVar12 = 0;
          do {
            if (string[uVar12] != (DdNode *)0x0) {
              free(string[uVar12]);
              string[uVar12] = (DdNode *)0x0;
            }
            uVar12 = uVar12 + 1;
          } while (uVar14 != uVar12);
        }
        free(string);
        free(__ptr);
        goto LAB_0080a79c;
      }
      dd->errorCode = CUDD_MEMORY_OUT;
      if (0 < k) {
        uVar12 = 0;
        do {
          if (string[uVar12] != (DdNode *)0x0) {
            free(string[uVar12]);
            string[uVar12] = (DdNode *)0x0;
          }
          uVar12 = uVar12 + 1;
        } while (uVar14 != uVar12);
      }
    }
    free(string);
    __ptr_00 = __ptr;
  }
  goto LAB_0080a79c;
LAB_0080a44f:
  bVar15 = true;
  bVar2 = false;
LAB_0080a466:
  if (0 < n) {
    uVar13 = 0;
    do {
      lVar11 = (long)*(int *)((long)__ptr + uVar13 * 4);
      if (*(char *)((long)&string[uVar6]->index + lVar11) == '2') {
        uVar7 = Cudd_Random();
        *(byte *)((long)&string[uVar6]->index + lVar11) = (uVar7 & 0x20) == 0 ^ 0x31;
      }
      uVar13 = uVar13 + 1;
    } while (uVar12 != uVar13);
  }
  if (!bVar15) {
    uVar13 = (ulong)local_7c;
    do {
      bVar15 = true;
      bVar3 = (long)uVar13 < (long)uVar6;
      if ((long)uVar13 < (long)uVar6) {
        pDVar5 = string[uVar6];
        iVar4 = strcmp((char *)pDVar5,(char *)string[uVar13]);
        bVar15 = iVar4 != 0;
        uVar7 = uVar13;
        if (bVar15) {
          do {
            uVar7 = uVar7 + 1;
            if (uVar6 == uVar7) break;
            iVar4 = strcmp((char *)pDVar5,(char *)string[uVar7]);
            bVar15 = iVar4 != 0;
          } while (bVar15);
          bVar3 = (long)uVar7 < (long)uVar6;
        }
      }
      if ((bVar3) && (strcpy((char *)string[uVar6],__s2), 0 < n)) {
        uVar7 = 0;
        do {
          lVar11 = (long)*(int *)((long)__ptr + uVar7 * 4);
          if (*(char *)((long)&string[uVar6]->index + lVar11) == '2') {
            uVar8 = Cudd_Random();
            *(byte *)((long)&string[uVar6]->index + lVar11) = (uVar8 & 0x20) == 0 ^ 0x31;
          }
          uVar7 = uVar7 + 1;
        } while (uVar12 != uVar7);
      }
    } while (!bVar15);
  }
  pDVar5 = Cudd_ReadOne(dd);
  __ptr_00[uVar6] = pDVar5;
  piVar1 = (int *)(((ulong)pDVar5 & 0xfffffffffffffffe) + 4);
  *piVar1 = *piVar1 + 1;
  if (0 < n) {
    uVar13 = 0;
    pDVar5 = __ptr_00[uVar6];
    do {
      pDVar9 = vars[uVar13];
      if (*(char *)((long)&string[uVar6]->index + (long)*(int *)((long)__ptr + uVar13 * 4)) == '0')
      {
        pDVar9 = (DdNode *)((ulong)pDVar9 ^ 1);
      }
      pDVar9 = Cudd_bddAnd(dd,pDVar5,pDVar9);
      if (pDVar9 == (DdNode *)0x0) {
        __ptr_00[uVar6] = pDVar5;
        free(__s2);
        uVar12 = 0;
        do {
          if (string[uVar12] != (DdNode *)0x0) {
            free(string[uVar12]);
            string[uVar12] = (DdNode *)0x0;
          }
          uVar12 = uVar12 + 1;
        } while (uVar14 != uVar12);
        free(string);
        free(__ptr);
        uVar14 = 0xffffffffffffffff;
        do {
          Cudd_RecursiveDeref(dd,__ptr_00[uVar14 + 1]);
          uVar14 = uVar14 + 1;
        } while (uVar6 != uVar14);
        goto LAB_0080a79c;
      }
      piVar1 = (int *)(((ulong)pDVar9 & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + 1;
      Cudd_RecursiveDeref(dd,pDVar5);
      uVar13 = uVar13 + 1;
      pDVar5 = pDVar9;
    } while (uVar12 != uVar13);
    __ptr_00[uVar6] = pDVar9;
  }
  iVar4 = Cudd_bddLeq(dd,__ptr_00[uVar6],f);
  if (iVar4 != 0) {
    uVar6 = uVar6 + 1;
    local_70 = local_70 - 1;
    if (uVar6 == uVar14) goto LAB_0080a64e;
    goto LAB_0080a3c7;
  }
  free(__s2);
  uVar12 = 0;
  do {
    if (string[uVar12] != (DdNode *)0x0) {
      free(string[uVar12]);
      string[uVar12] = (DdNode *)0x0;
    }
    uVar12 = uVar12 + 1;
  } while (uVar14 != uVar12);
  free(string);
  free(__ptr);
  uVar14 = 0xffffffffffffffff;
  do {
    Cudd_RecursiveDeref(dd,__ptr_00[uVar14 + 1]);
    uVar14 = uVar14 + 1;
  } while (uVar6 != uVar14);
LAB_0080a79c:
  free(__ptr_00);
  return (DdNode **)0x0;
}

Assistant:

DdNode **
Cudd_bddPickArbitraryMinterms(
  DdManager * dd /* manager */,
  DdNode * f /* function from which to pick k minterms */,
  DdNode ** vars /* array of variables */,
  int  n /* size of <code>vars</code> */,
  int  k /* number of minterms to find */)
{
    char **string;
    int i, j, l, size;
    int *indices;
    int result;
    DdNode **old, *neW;
    double minterms;
    char *saveString;
    int saveFlag, savePoint = -1, isSame;

    minterms = Cudd_CountMinterm(dd,f,n);
    if ((double)k > minterms) {
        return(NULL);
    }

    size = dd->size;
    string = ABC_ALLOC(char *, k);
    if (string == NULL) {
        dd->errorCode = CUDD_MEMORY_OUT;
        return(NULL);
    }
    for (i = 0; i < k; i++) {
        string[i] = ABC_ALLOC(char, size + 1);
        if (string[i] == NULL) {
            for (j = 0; j < i; j++)
                ABC_FREE(string[i]);
            ABC_FREE(string);
            dd->errorCode = CUDD_MEMORY_OUT;
            return(NULL);
        }
        for (j = 0; j < size; j++) string[i][j] = '2';
        string[i][size] = '\0';
    }
    indices = ABC_ALLOC(int,n);
    if (indices == NULL) {
        dd->errorCode = CUDD_MEMORY_OUT;
        for (i = 0; i < k; i++)
            ABC_FREE(string[i]);
        ABC_FREE(string);
        return(NULL);
    }

    for (i = 0; i < n; i++) {
        indices[i] = vars[i]->index;
    }

    result = ddPickArbitraryMinterms(dd,f,n,k,string);
    if (result == 0) {
        for (i = 0; i < k; i++)
            ABC_FREE(string[i]);
        ABC_FREE(string);
        ABC_FREE(indices);
        return(NULL);
    }

    old = ABC_ALLOC(DdNode *, k);
    if (old == NULL) {
        dd->errorCode = CUDD_MEMORY_OUT;
        for (i = 0; i < k; i++)
            ABC_FREE(string[i]);
        ABC_FREE(string);
        ABC_FREE(indices);
        return(NULL);
    }
    saveString = ABC_ALLOC(char, size + 1);
    if (saveString == NULL) {
        dd->errorCode = CUDD_MEMORY_OUT;
        for (i = 0; i < k; i++)
            ABC_FREE(string[i]);
        ABC_FREE(string);
        ABC_FREE(indices);
        ABC_FREE(old);
        return(NULL);
    }
    saveFlag = 0;

    /* Build result BDD array. */
    for (i = 0; i < k; i++) {
        isSame = 0;
        if (!saveFlag) {
            for (j = i + 1; j < k; j++) {
                if (strcmp(string[i], string[j]) == 0) {
                    savePoint = i;
                    strcpy(saveString, string[i]);
                    saveFlag = 1;
                    break;
                }
            }
        } else {
            if (strcmp(string[i], saveString) == 0) {
                isSame = 1;
            } else {
                saveFlag = 0;
                for (j = i + 1; j < k; j++) {
                    if (strcmp(string[i], string[j]) == 0) {
                        savePoint = i;
                        strcpy(saveString, string[i]);
                        saveFlag = 1;
                        break;
                    }
                }
            }
        }
        /* Randomize choice for don't cares. */
        for (j = 0; j < n; j++) {
            if (string[i][indices[j]] == '2')
                string[i][indices[j]] =
                  (char) ((Cudd_Random() & 0x20) ? '1' : '0');
        }

        while (isSame) {
            isSame = 0;
            for (j = savePoint; j < i; j++) {
                if (strcmp(string[i], string[j]) == 0) {
                    isSame = 1;
                    break;
                }
            }
            if (isSame) {
                strcpy(string[i], saveString);
                /* Randomize choice for don't cares. */
                for (j = 0; j < n; j++) {
                    if (string[i][indices[j]] == '2')
                        string[i][indices[j]] =
                          (char) ((Cudd_Random() & 0x20) ? '1' : '0');
                }
            }
        }

        old[i] = Cudd_ReadOne(dd);
        cuddRef(old[i]);

        for (j = 0; j < n; j++) {
            if (string[i][indices[j]] == '0') {
                neW = Cudd_bddAnd(dd,old[i],Cudd_Not(vars[j]));
            } else {
                neW = Cudd_bddAnd(dd,old[i],vars[j]);
            }
            if (neW == NULL) {
                ABC_FREE(saveString);
                for (l = 0; l < k; l++)
                    ABC_FREE(string[l]);
                ABC_FREE(string);
                ABC_FREE(indices);
                for (l = 0; l <= i; l++)
                    Cudd_RecursiveDeref(dd,old[l]);
                ABC_FREE(old);
                return(NULL);
            }
            cuddRef(neW);
            Cudd_RecursiveDeref(dd,old[i]);
            old[i] = neW;
        }

        /* Test. */
        if (!Cudd_bddLeq(dd,old[i],f)) {
            ABC_FREE(saveString);
            for (l = 0; l < k; l++)
                ABC_FREE(string[l]);
            ABC_FREE(string);
            ABC_FREE(indices);
            for (l = 0; l <= i; l++)
                Cudd_RecursiveDeref(dd,old[l]);
            ABC_FREE(old);
            return(NULL);
        }
    }

    ABC_FREE(saveString);
    for (i = 0; i < k; i++) {
        cuddDeref(old[i]);
        ABC_FREE(string[i]);
    }
    ABC_FREE(string);
    ABC_FREE(indices);
    return(old);

}